

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseBuilder::_emit
          (BaseBuilder *this,InstId instId,Operand_ *o0,Operand_ *o1,Operand_ *o2,Operand_ *opExt)

{
  bool bVar1;
  Error EVar2;
  int iVar3;
  InstNode *pIVar4;
  undefined4 extraout_var;
  Operand_ *in_RCX;
  Operand_ *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  Operand_ *in_R8;
  Operand_ *in_R9;
  Operand_ *in_stack_00000010;
  Operand_ *in_stack_00000018;
  uint32_t i;
  char *comment;
  InstNode *node;
  uint32_t opCapacity;
  Error err;
  ValidationFlags validationFlags;
  Operand_ opArray [6];
  InstOptions options;
  uint32_t opCount;
  size_t in_stack_fffffffffffffce8;
  Operand_ *in_stack_fffffffffffffcf0;
  uint32_t in_stack_fffffffffffffcfc;
  BaseEmitter *in_stack_fffffffffffffd00;
  BaseBuilder *in_stack_fffffffffffffd08;
  InstNode *local_2d0;
  uint local_2c0;
  InstNode *local_2b0;
  BaseBuilder *local_2a8;
  InstNode *local_2a0;
  uint local_294;
  undefined4 local_290;
  InstOptions local_28c;
  undefined8 local_288;
  int local_280;
  uint local_27c;
  Operand_ local_278 [6];
  InstOptions local_210;
  uint32_t local_20c;
  Operand_ *local_208;
  Operand_ *local_200;
  Operand_ *local_1f8;
  Operand_ *local_1f0;
  undefined4 local_1e4;
  Error local_1d4;
  uint local_1d0;
  uint local_1cc;
  InstNode **local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  uint local_1b4;
  InstOptions local_1b0;
  undefined4 local_1ac;
  InstNode *local_1a0;
  InstOptions local_198;
  InstOptions local_194;
  undefined4 local_17c;
  undefined8 *local_168;
  InstOptions local_160;
  undefined4 local_15c;
  undefined4 *local_158;
  undefined4 local_14c;
  InstOptions *local_148;
  undefined4 local_13c;
  Operand_ *in_stack_fffffffffffffec8;
  Operand_ *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  InstOptions options_00;
  undefined8 in_stack_fffffffffffffee0;
  BaseEmitter *in_stack_fffffffffffffee8;
  undefined4 local_b4;
  undefined4 *local_b0;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_6c;
  undefined4 *local_68;
  undefined4 *local_60;
  undefined4 *local_58;
  InstNode *local_50;
  undefined4 local_44;
  undefined4 *local_40;
  InstNode *local_38;
  undefined4 local_2c;
  undefined4 *local_28;
  InstNode *local_20;
  undefined4 *local_18;
  undefined4 local_c;
  undefined4 *local_8;
  
  options_00 = (InstOptions)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  local_208 = in_R9;
  local_200 = in_R8;
  local_1f8 = in_RCX;
  local_1f0 = in_RDX;
  local_1e4 = in_ESI;
  local_20c = EmitterUtils::opCountFromEmitArgs(in_RDX,in_RCX,in_R8,in_R9);
  local_194 = *(InstOptions *)(in_RDI + 0x54);
  local_198 = *(InstOptions *)(in_RDI + 0x24);
  local_210 = local_194 | local_198;
  bVar1 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>(local_210,kReserved);
  if (bVar1) {
    if (*(long *)(in_RDI + 0x30) == 0) {
      EVar2 = DebugUtils::errored(5);
      return EVar2;
    }
    local_17c = 2;
    bVar1 = Support::test<asmjit::v1_14::DiagnosticOptions,asmjit::v1_14::DiagnosticOptions>
                      (*(DiagnosticOptions *)(in_RDI + 0x10),kValidateIntermediate);
    if (bVar1) {
      EmitterUtils::opArrayFromEmitArgs(local_278,local_1f0,local_1f8,local_200,local_208);
      local_27c = (uint)(*(char *)(in_RDI + 8) == '\x03');
      local_168 = (undefined8 *)(in_RDI + 0x58);
      local_158 = &local_290;
      local_15c = local_1e4;
      local_160 = local_210;
      local_290 = local_1e4;
      local_28c = local_210;
      local_288 = *local_168;
      local_280 = (**(code **)(in_RDI + 0x88))(&local_290,local_278,local_20c,local_27c);
      if (local_280 != 0) {
        EVar2 = EmitterUtils::logInstructionFailed
                          (in_stack_fffffffffffffee8,
                           (Error)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                           (InstId)in_stack_fffffffffffffee0,options_00,in_stack_fffffffffffffed0,
                           in_stack_fffffffffffffec8,in_stack_00000010,in_stack_00000018);
        return EVar2;
      }
      local_280 = 0;
    }
    local_13c = 1;
    local_14c = 0xfffffffe;
    local_148 = &local_210;
    local_210 = local_210 & ~kReserved;
  }
  local_1d0 = local_20c;
  local_294 = 6;
  if (local_20c < 5) {
    local_294 = 4;
  }
  if (3 < local_294) {
    local_1cc = local_294;
    pIVar4 = ZoneAllocator::allocT<asmjit::v1_14::InstNode>
                       ((ZoneAllocator *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    local_2a8 = *(BaseBuilder **)(in_RDI + 0x60);
    *(undefined4 *)(in_RDI + 0x54) = 0;
    *(undefined8 *)(in_RDI + 0x60) = 0;
    local_2a0 = pIVar4;
    if (pIVar4 == (InstNode *)0x0) {
      local_b0 = (undefined4 *)(in_RDI + 0x58);
      local_a4 = 0;
      local_a0 = 0;
      local_b4 = 0;
      local_68 = &local_b4;
      local_6c = 0;
      *local_b0 = 0;
      *(undefined4 *)(in_RDI + 0x5c) = 0;
      local_60 = local_b0;
      DebugUtils::errored(1);
      local_1d4 = BaseEmitter::reportError
                            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                             (char *)in_stack_fffffffffffffcf0);
    }
    else {
      local_1c0 = 0x40;
      local_1c8 = &local_2b0;
      local_2d0 = (InstNode *)0x0;
      local_2b0 = pIVar4;
      if (pIVar4 != (InstNode *)0x0) {
        local_1ac = local_1e4;
        local_1b0 = local_210;
        local_1b4 = local_20c;
        local_1b8 = local_294;
        *(undefined8 *)pIVar4 = 0;
        *(undefined8 *)(pIVar4 + 8) = 0;
        pIVar4[0x10] = (InstNode)0x1;
        pIVar4[0x11] = (InstNode)(*(byte *)(in_RDI + 0x1b0) | 0x29);
        pIVar4[0x12] = (InstNode)0x0;
        pIVar4[0x13] = (InstNode)0x0;
        *(undefined4 *)(pIVar4 + 0x14) = 0;
        *(undefined8 *)(pIVar4 + 0x18) = 0;
        *(undefined8 *)(pIVar4 + 0x20) = 0;
        *(undefined8 *)(pIVar4 + 0x28) = 0;
        *(undefined4 *)(pIVar4 + 0x30) = local_1e4;
        *(InstOptions *)(pIVar4 + 0x34) = local_210;
        local_1a0 = pIVar4;
        memset(pIVar4 + 0x38,0,8);
        pIVar4[0x13] = SUB41(local_1b8,0);
        pIVar4[0x12] = SUB41(local_1b4,0);
        local_2d0 = pIVar4;
      }
      local_2a0 = local_2d0;
      local_58 = (undefined4 *)(in_RDI + 0x58);
      local_50 = local_2d0 + 0x30;
      local_38 = local_2d0 + 0x38;
      local_44 = *local_58;
      local_2c = *(undefined4 *)(in_RDI + 0x5c);
      local_28 = &local_44;
      *(undefined4 *)local_38 = local_44;
      *(undefined4 *)(local_2d0 + 0x3c) = local_2c;
      local_40 = local_58;
      local_20 = local_38;
      local_18 = local_58;
      local_c = local_44;
      local_8 = local_58;
      InstNode::setOp((InstNode *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                      in_stack_fffffffffffffcf0);
      InstNode::setOp((InstNode *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                      in_stack_fffffffffffffcf0);
      InstNode::setOp((InstNode *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                      in_stack_fffffffffffffcf0);
      for (local_2c0 = 3; local_2c0 < local_20c; local_2c0 = local_2c0 + 1) {
        InstNode::setOp((InstNode *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                        in_stack_fffffffffffffcf0);
      }
      InstNode::resetOpRange(local_2a0,local_20c,local_294);
      pIVar4 = local_2a0;
      if (local_2a8 != (BaseBuilder *)0x0) {
        in_stack_fffffffffffffd00 = (BaseEmitter *)(in_RDI + 0xb8);
        in_stack_fffffffffffffd08 = local_2a8;
        strlen((char *)local_2a8);
        iVar3 = Zone::dup((Zone *)in_stack_fffffffffffffd00,(int)in_stack_fffffffffffffd08);
        *(ulong *)(pIVar4 + 0x28) = CONCAT44(extraout_var,iVar3);
      }
      addNode(in_stack_fffffffffffffd08,(BaseNode *)in_stack_fffffffffffffd00);
      *(undefined4 *)(in_RDI + 0x58) = 0;
      *(undefined4 *)(in_RDI + 0x5c) = 0;
      local_1d4 = 0;
    }
    return local_1d4;
  }
  DebugUtils::assertionFailed((char *)opArray[5]._0_8_,opArray[4]._data[1],(char *)opArray[4]._0_8_)
  ;
}

Assistant:

Error BaseBuilder::_emit(InstId instId, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt) {
  uint32_t opCount = EmitterUtils::opCountFromEmitArgs(o0, o1, o2, opExt);
  InstOptions options = instOptions() | forcedInstOptions();

  if (Support::test(options, InstOptions::kReserved)) {
    if (ASMJIT_UNLIKELY(!_code))
      return DebugUtils::errored(kErrorNotInitialized);

#ifndef ASMJIT_NO_VALIDATION
    // Strict validation.
    if (hasDiagnosticOption(DiagnosticOptions::kValidateIntermediate)) {
      Operand_ opArray[Globals::kMaxOpCount];
      EmitterUtils::opArrayFromEmitArgs(opArray, o0, o1, o2, opExt);

      ValidationFlags validationFlags = isCompiler() ? ValidationFlags::kEnableVirtRegs : ValidationFlags::kNone;
      Error err = _funcs.validate(BaseInst(instId, options, _extraReg), opArray, opCount, validationFlags);

      if (ASMJIT_UNLIKELY(err)) {
#ifndef ASMJIT_NO_LOGGING
        return EmitterUtils::logInstructionFailed(this, err, instId, options, o0, o1, o2, opExt);
#else
        resetState();
        return reportError(err);
#endif
      }
    }
#endif

    // Clear instruction options that should never be part of a regular instruction.
    options &= ~InstOptions::kReserved;
  }

  uint32_t opCapacity = InstNode::capacityOfOpCount(opCount);
  ASMJIT_ASSERT(opCapacity >= InstNode::kBaseOpCapacity);

  InstNode* node = _allocator.allocT<InstNode>(InstNode::nodeSizeOfOpCapacity(opCapacity));
  const char* comment = inlineComment();

  resetInstOptions();
  resetInlineComment();

  if (ASMJIT_UNLIKELY(!node)) {
    resetExtraReg();
    return reportError(DebugUtils::errored(kErrorOutOfMemory));
  }

  node = new(Support::PlacementNew{node}) InstNode(this, instId, options, opCount, opCapacity);
  node->setExtraReg(extraReg());
  node->setOp(0, o0);
  node->setOp(1, o1);
  node->setOp(2, o2);
  for (uint32_t i = 3; i < opCount; i++)
    node->setOp(i, opExt[i - 3]);
  node->resetOpRange(opCount, opCapacity);

  if (comment)
    node->setInlineComment(static_cast<char*>(_dataZone.dup(comment, strlen(comment), true)));

  addNode(node);
  resetExtraReg();
  return kErrorOk;
}